

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O0

bool anon_unknown.dwarf_ecfb9a::IsAsciiSTL(char *buffer,uint fileSize)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_30;
  bool local_29;
  uint i;
  bool isASCII;
  char *bufferEnd;
  char *pcStack_18;
  uint fileSize_local;
  char *buffer_local;
  
  pcStack_18 = buffer;
  bVar1 = IsBinarySTL(buffer,fileSize);
  if (bVar1) {
    buffer_local._7_1_ = false;
  }
  else {
    pcVar3 = pcStack_18 + fileSize;
    bVar1 = Assimp::SkipSpaces<char>(&stack0xffffffffffffffe8);
    if (bVar1) {
      if (pcStack_18 + 5 < pcVar3) {
        iVar2 = strncmp(pcStack_18,"solid",5);
        local_29 = iVar2 == 0;
        if ((local_29) && (499 < fileSize)) {
          local_29 = true;
          for (local_30 = 0; local_30 < 500; local_30 = local_30 + 1) {
            if ('\x7f' < pcStack_18[local_30]) {
              local_29 = false;
              break;
            }
          }
        }
        buffer_local._7_1_ = local_29;
      }
      else {
        buffer_local._7_1_ = false;
      }
    }
    else {
      buffer_local._7_1_ = false;
    }
  }
  return buffer_local._7_1_;
}

Assistant:

static bool IsAsciiSTL(const char* buffer, unsigned int fileSize) {
    if (IsBinarySTL(buffer, fileSize))
        return false;

    const char* bufferEnd = buffer + fileSize;

    if (!SkipSpaces(&buffer))
        return false;

    if (buffer + 5 >= bufferEnd)
        return false;

    bool isASCII( strncmp( buffer, "solid", 5 ) == 0 );
    if( isASCII ) {
        // A lot of importers are write solid even if the file is binary. So we have to check for ASCII-characters.
        if( fileSize >= BufferSize) {
            isASCII = true;
            for( unsigned int i = 0; i < BufferSize; i++ ) {
                if( buffer[ i ] > UnicodeBoundary) {
                    isASCII = false;
                    break;
                }
            }
        }
    }
    return isASCII;
}